

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottie2gif.cpp
# Opt level: O3

int __thiscall App::setup(App *this,int argc,char **argv,size_t *width,size_t *height)

{
  char *__s;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  string *this_00;
  array<char,_5000UL> memory;
  long *local_13d8 [2];
  long local_13c8 [2];
  char local_13b8 [5000];
  
  *height = 200;
  *width = 200;
  if (1 < argc) {
    pcVar5 = argv[1];
    if (argc != 2) {
      __s = argv[2];
      pcVar3 = strchr(__s,0x78);
      if (pcVar3 != (char *)0x0) {
        snprintf(local_13b8,(size_t)(pcVar3 + (1 - (long)__s)),"%s",__s);
        iVar2 = atoi(local_13b8);
        *width = (long)iVar2;
        snprintf(local_13b8,0x14,"%s",pcVar3 + 1);
        iVar2 = atoi(local_13b8);
        *height = (long)iVar2;
      }
      if (3 < (uint)argc) {
        lVar4 = strtol(argv[3],(char **)0x0,0x10);
        this->bgColor = (int)lVar4;
      }
    }
    if ((pcVar5 != (char *)0x0) && (pcVar5 = realpath(pcVar5,local_13b8), pcVar5 != (char *)0x0)) {
      local_13d8[0] = local_13c8;
      sVar6 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_13d8,pcVar5,pcVar5 + sVar6);
      this_00 = &this->fileName;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_13d8);
      if (local_13d8[0] != local_13c8) {
        operator_delete(local_13d8[0],local_13c8[0] + 1);
      }
      bVar1 = jsonFile(this);
      if (bVar1) {
        std::__cxx11::string::find_last_of((char *)this_00,0x105129,0xffffffffffffffff);
        std::__cxx11::string::substr((ulong)local_13d8,(ulong)this_00);
        std::__cxx11::string::operator=((string *)&this->gifName,(string *)local_13d8);
        if (local_13d8[0] != local_13c8) {
          operator_delete(local_13d8[0],local_13c8[0] + 1);
        }
        std::__cxx11::string::append((char *)&this->gifName);
        return 0;
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Usage: \n   lottie2gif [lottieFileName] [Resolution] [bgColor]\n\nExamples: \n    $ lottie2gif input.json\n    $ lottie2gif input.json 200x200\n    $ lottie2gif input.json 200x200 ff00ff\n\n"
             ,0xb6);
  return 1;
}

Assistant:

int setup(int argc, char **argv, size_t *width, size_t *height)
    {
        char *path{nullptr};

        *width = *height = 200;   //default gif size

        if (argc > 1) path = argv[1];
        if (argc > 2) {
            char tmp[20];
            char *x = strstr(argv[2], "x");
            if (x) {
                snprintf(tmp, x - argv[2] + 1, "%s", argv[2]);
                *width = atoi(tmp);
                snprintf(tmp, sizeof(tmp), "%s", x + 1);
                *height = atoi(tmp);
            }
        }
        if (argc > 3) bgColor = strtol(argv[3], NULL, 16);

        if (!path) return help();

        std::array<char, 5000> memory;

#ifdef _WIN32
        path = _fullpath(memory.data(), path, memory.size());
#else
        path = realpath(path, memory.data());
#endif
        if (!path) return help();

        fileName = std::string(path);

        if (!jsonFile()) return help();

        gifName = basename(fileName);
        gifName.append(".gif");
        return 0;
    }